

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::BlockManager::ReadBlockFromDisk(BlockManager *this,CBlock *block,FlatFilePos *pos)

{
  long lVar1;
  CChainParams *consensusParams;
  uint256 hash;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  char *in_stack_fffffffffffffea0;
  char (*in_stack_fffffffffffffea8) [18];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  AutoFile filein;
  undefined1 local_110 [16];
  char (*local_100) [18];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_f8;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::SetNull(block);
  OpenBlockFile(&filein,this,pos,true);
  if (filein.m_file == (FILE *)0x0) {
    FlatFilePos::ToString_abi_cxx11_(&log_msg,pos);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_00._M_len = 0x5e;
    logging_function_00._M_str = "ReadBlockFromDisk";
    logging_function_00._M_len = 0x11;
    LogPrintf_<char[18],std::__cxx11::string>
              (logging_function_00,source_file_00,0x414,
               IPC|I2P|QT|LIBEVENT|MEMPOOLREJ|RAND|CMPCTBLOCK|SELECTCOINS|ADDRMAN|WALLETDB|ZMQ|BENCH
               |HTTP|TOR|NET,(Level)&log_msg,in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,
               in_stack_fffffffffffffeb0);
  }
  else {
    log_msg._M_dataplus._M_p = "\x01";
    log_msg._M_string_length = (size_type)block;
    ParamsWrapper<TransactionSerParams,_CBlock>::Unserialize<AutoFile>
              ((ParamsWrapper<TransactionSerParams,_CBlock> *)&log_msg,&filein);
    CBlockHeader::GetHash((uint256 *)local_110,&block->super_CBlockHeader);
    hash.super_base_blob<256U>.m_data._M_elems[8] = local_110[8];
    hash.super_base_blob<256U>.m_data._M_elems[9] = local_110[9];
    hash.super_base_blob<256U>.m_data._M_elems[10] = local_110[10];
    hash.super_base_blob<256U>.m_data._M_elems[0xb] = local_110[0xb];
    hash.super_base_blob<256U>.m_data._M_elems[0xc] = local_110[0xc];
    hash.super_base_blob<256U>.m_data._M_elems[0xd] = local_110[0xd];
    hash.super_base_blob<256U>.m_data._M_elems[0xe] = local_110[0xe];
    hash.super_base_blob<256U>.m_data._M_elems[0xf] = local_110[0xf];
    hash.super_base_blob<256U>.m_data._M_elems[0] = local_110[0];
    hash.super_base_blob<256U>.m_data._M_elems[1] = local_110[1];
    hash.super_base_blob<256U>.m_data._M_elems[2] = local_110[2];
    hash.super_base_blob<256U>.m_data._M_elems[3] = local_110[3];
    hash.super_base_blob<256U>.m_data._M_elems[4] = local_110[4];
    hash.super_base_blob<256U>.m_data._M_elems[5] = local_110[5];
    hash.super_base_blob<256U>.m_data._M_elems[6] = local_110[6];
    hash.super_base_blob<256U>.m_data._M_elems[7] = local_110[7];
    hash.super_base_blob<256U>.m_data._M_elems._16_8_ = local_100;
    hash.super_base_blob<256U>.m_data._M_elems._24_8_ = pbStack_f8;
    bVar2 = CheckProofOfWork(hash,(block->super_CBlockHeader).nBits,
                             &((this->m_opts).chainparams)->consensus);
    if (bVar2) {
      consensusParams = (this->m_opts).chainparams;
      bVar2 = true;
      if ((consensusParams->consensus).signet_blocks != true) goto LAB_007643f6;
      bVar3 = CheckSignetBlockSolution(block,&consensusParams->consensus);
      if (bVar3) goto LAB_007643f6;
      FlatFilePos::ToString_abi_cxx11_(&log_msg,pos);
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file._M_len = 0x5e;
      logging_function._M_str = "ReadBlockFromDisk";
      logging_function._M_len = 0x11;
      LogPrintf_<char[18],std::__cxx11::string>
                (logging_function,source_file,0x428,
                 IPC|I2P|QT|LIBEVENT|MEMPOOLREJ|RAND|CMPCTBLOCK|SELECTCOINS|ADDRMAN|RPC|ZMQ|BENCH|
                 HTTP|MEMPOOL|TOR,(Level)&log_msg,(char *)local_110._8_8_,local_100,pbStack_f8);
    }
    else {
      FlatFilePos::ToString_abi_cxx11_(&log_msg,pos);
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_01._M_len = 0x5e;
      logging_function_01._M_str = "ReadBlockFromDisk";
      logging_function_01._M_len = 0x11;
      LogPrintf_<char[18],std::__cxx11::string>
                (logging_function_01,source_file_01,0x422,
                 IPC|I2P|QT|LIBEVENT|MEMPOOLREJ|RAND|CMPCTBLOCK|SELECTCOINS|ADDRMAN|RPC|BENCH|HTTP|
                 MEMPOOL,(Level)&log_msg,(char *)local_110._8_8_,local_100,pbStack_f8);
    }
  }
  std::__cxx11::string::~string((string *)&log_msg);
  bVar2 = false;
LAB_007643f6:
  AutoFile::~AutoFile(&filein);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::ReadBlockFromDisk(CBlock& block, const FlatFilePos& pos) const
{
    block.SetNull();

    // Open history file to read
    AutoFile filein{OpenBlockFile(pos, true)};
    if (filein.IsNull()) {
        LogError("%s: OpenBlockFile failed for %s\n", __func__, pos.ToString());
        return false;
    }

    // Read block
    try {
        filein >> TX_WITH_WITNESS(block);
    } catch (const std::exception& e) {
        LogError("%s: Deserialize or I/O error - %s at %s\n", __func__, e.what(), pos.ToString());
        return false;
    }

    // Check the header
    if (!CheckProofOfWork(block.GetHash(), block.nBits, GetConsensus())) {
        LogError("%s: Errors in block header at %s\n", __func__, pos.ToString());
        return false;
    }

    // Signet only: check block solution
    if (GetConsensus().signet_blocks && !CheckSignetBlockSolution(block, GetConsensus())) {
        LogError("%s: Errors in block solution at %s\n", __func__, pos.ToString());
        return false;
    }

    return true;
}